

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O2

string * __thiscall
yactfr::internal::SaveValInstr::_toStr_abi_cxx11_
          (string *__return_storage_ptr__,SaveValInstr *this,Size param_1)

{
  ostream *poVar1;
  ostringstream ss;
  allocator local_1d1;
  string local_1d0;
  string local_1b0;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190," ");
  std::__cxx11::string::string((string *)&local_1d0,"pos",&local_1d1);
  _strProp(&local_1b0,&local_1d0);
  poVar1 = std::operator<<(poVar1,(string *)&local_1b0);
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar1);
  poVar1 = std::operator<<(poVar1," ");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string SaveValInstr::_toStr(Size) const
{
    std::ostringstream ss;

    ss << " " << _strProp("pos") << _pos << " " << std::endl;
    return ss.str();
}